

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::editorDestroyed(QAbstractItemView *this,QObject *editor)

{
  State SVar1;
  QAbstractItemViewPrivate *pQVar2;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QWidget *w;
  QWidget *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffc8;
  State in_stack_ffffffffffffffcc;
  QWidget *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QAbstractItemView *)0x80b9bf);
  local_10 = qobject_cast<QWidget*>
                       ((QObject *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  QAbstractItemViewPrivate::removeEditor(d,in_stack_00000048);
  QSet<QWidget_*>::remove(&pQVar2->persistent,(char *)&local_10);
  SVar1 = state(in_RDI);
  if (SVar1 == EditingState) {
    setState(in_RDI,in_stack_ffffffffffffffcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::editorDestroyed(QObject *editor)
{
    Q_D(QAbstractItemView);
    QWidget *w = qobject_cast<QWidget*>(editor);
    d->removeEditor(w);
    d->persistent.remove(w);
    if (state() == EditingState)
        setState(NoState);
}